

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

buffered_file open_buffered_file(FILE **fp)

{
  size_t in_RCX;
  int __fd;
  undefined8 *in_RSI;
  file write_end;
  file read_end;
  undefined8 local_18;
  
  local_18 = 0xffffffffffffffff;
  fmt::v5::file::pipe((file *)((long)&local_18 + 4),(int *)&local_18);
  __fd = 0x15d273;
  fmt::v5::file::write((file *)&local_18,0x15d273,(void *)0xc,in_RCX);
  fmt::v5::file::close((file *)&local_18,__fd);
  fmt::v5::file::fdopen((file *)fp,(int)&local_18 + 4,"r");
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = *fp;
  }
  fmt::v5::file::~file((file *)&local_18);
  fmt::v5::file::~file((file *)((long)&local_18 + 4));
  return (buffered_file)(FILE *)fp;
}

Assistant:

fmt::buffered_file open_buffered_file(FILE **fp) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  write_end.write(FILE_CONTENT, std::strlen(FILE_CONTENT));
  write_end.close();
  fmt::buffered_file f = read_end.fdopen("r");
  if (fp)
    *fp = f.get();
  return f;
}